

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenArrayCopySetSrcIndex(BinaryenExpressionRef expr,BinaryenExpressionRef srcIndexExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef srcIndexExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::ArrayCopy>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<ArrayCopy>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x117f,
                  "void BinaryenArrayCopySetSrcIndex(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (srcIndexExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)srcIndexExpr;
    return;
  }
  __assert_fail("srcIndexExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x1180,
                "void BinaryenArrayCopySetSrcIndex(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenArrayCopySetSrcIndex(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef srcIndexExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayCopy>());
  assert(srcIndexExpr);
  static_cast<ArrayCopy*>(expression)->srcIndex = (Expression*)srcIndexExpr;
}